

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *tmp;
  xmlChar *pxStack_a8;
  int max;
  xmlChar *buffer;
  int local_98;
  int maxLength;
  int count;
  int c;
  int l;
  int len;
  xmlChar buf [105];
  xmlParserCtxtPtr ctxt_local;
  
  c = 0;
  local_98 = 0;
  iVar2 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar2 = 10000000;
  }
  unique0x100004d7 = ctxt;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (stack0xffffffffffffffe8->instate != XML_PARSER_EOF) {
    maxLength = xmlCurrentChar(stack0xffffffffffffffe8,&count);
    do {
      iVar3 = xmlIsNameChar(stack0xffffffffffffffe8,maxLength);
      if (iVar3 == 0) {
        if (c == 0) {
          return (xmlChar *)0x0;
        }
        if (c <= iVar2) {
          pxVar4 = xmlStrndup((xmlChar *)&l,c);
          return pxVar4;
        }
        xmlFatalErr(stack0xffffffffffffffe8,XML_ERR_NAME_TOO_LONG,"NmToken");
        return (xmlChar *)0x0;
      }
      bVar1 = 100 < local_98;
      local_98 = local_98 + 1;
      if (((bVar1) && (local_98 = 0, stack0xffffffffffffffe8->progressive == 0)) &&
         ((long)stack0xffffffffffffffe8->input->end - (long)stack0xffffffffffffffe8->input->cur <
          0xfa)) {
        xmlGROW(stack0xffffffffffffffe8);
      }
      if (count == 1) {
        *(char *)((long)&l + (long)c) = (char)maxLength;
        c = c + 1;
      }
      else {
        iVar3 = xmlCopyCharMultiByte((xmlChar *)((long)&l + (long)c),maxLength);
        c = iVar3 + c;
      }
      if (*stack0xffffffffffffffe8->input->cur == '\n') {
        stack0xffffffffffffffe8->input->line = stack0xffffffffffffffe8->input->line + 1;
        stack0xffffffffffffffe8->input->col = 1;
      }
      else {
        stack0xffffffffffffffe8->input->col = stack0xffffffffffffffe8->input->col + 1;
      }
      stack0xffffffffffffffe8->input->cur = stack0xffffffffffffffe8->input->cur + count;
      maxLength = xmlCurrentChar(stack0xffffffffffffffe8,&count);
      if (maxLength == 0) {
        local_98 = 0;
        if ((stack0xffffffffffffffe8->progressive == 0) &&
           ((long)stack0xffffffffffffffe8->input->end - (long)stack0xffffffffffffffe8->input->cur <
            0xfa)) {
          xmlGROW(stack0xffffffffffffffe8);
        }
        if (stack0xffffffffffffffe8->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        maxLength = xmlCurrentChar(stack0xffffffffffffffe8,&count);
      }
    } while (c < 100);
    tmp._4_4_ = c << 1;
    pxStack_a8 = (xmlChar *)(*xmlMallocAtomic)((long)tmp._4_4_);
    if (pxStack_a8 == (xmlChar *)0x0) {
      xmlErrMemory(stack0xffffffffffffffe8,(char *)0x0);
    }
    else {
      memcpy(pxStack_a8,&l,(long)c);
      do {
        iVar3 = xmlIsNameChar(stack0xffffffffffffffe8,maxLength);
        if (iVar3 == 0) {
          pxStack_a8[c] = '\0';
          return pxStack_a8;
        }
        bVar1 = 100 < local_98;
        local_98 = local_98 + 1;
        if (bVar1) {
          local_98 = 0;
          if ((stack0xffffffffffffffe8->progressive == 0) &&
             ((long)stack0xffffffffffffffe8->input->end - (long)stack0xffffffffffffffe8->input->cur
              < 0xfa)) {
            xmlGROW(stack0xffffffffffffffe8);
          }
          if (stack0xffffffffffffffe8->instate == XML_PARSER_EOF) {
            (*xmlFree)(pxStack_a8);
            return (xmlChar *)0x0;
          }
        }
        pxVar4 = pxStack_a8;
        if (tmp._4_4_ < c + 10) {
          tmp._4_4_ = tmp._4_4_ << 1;
          pxVar4 = (xmlChar *)(*xmlRealloc)(pxStack_a8,(long)tmp._4_4_);
          if (pxVar4 == (xmlChar *)0x0) {
            xmlErrMemory(stack0xffffffffffffffe8,(char *)0x0);
            (*xmlFree)(pxStack_a8);
            return (xmlChar *)0x0;
          }
        }
        pxStack_a8 = pxVar4;
        if (count == 1) {
          pxStack_a8[c] = (xmlChar)maxLength;
          c = c + 1;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(pxStack_a8 + c,maxLength);
          c = iVar3 + c;
        }
        if (*stack0xffffffffffffffe8->input->cur == '\n') {
          stack0xffffffffffffffe8->input->line = stack0xffffffffffffffe8->input->line + 1;
          stack0xffffffffffffffe8->input->col = 1;
        }
        else {
          stack0xffffffffffffffe8->input->col = stack0xffffffffffffffe8->input->col + 1;
        }
        stack0xffffffffffffffe8->input->cur = stack0xffffffffffffffe8->input->cur + count;
        maxLength = xmlCurrentChar(stack0xffffffffffffffe8,&count);
      } while (c <= iVar2);
      xmlFatalErr(stack0xffffffffffffffe8,XML_ERR_NAME_TOO_LONG,"NmToken");
      (*xmlFree)(pxStack_a8);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;
    int count = 0;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

#ifdef DEBUG
    nbParseNmToken++;
#endif

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);
    c = CUR_CHAR(l);

    while (xmlIsNameChar(ctxt, c)) {
	if (count++ > XML_PARSER_CHUNK_SIZE) {
	    count = 0;
	    GROW;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (c == 0) {
	    count = 0;
	    GROW;
	    if (ctxt->instate == XML_PARSER_EOF)
		return(NULL);
            c = CUR_CHAR(l);
	}
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (count++ > XML_PARSER_CHUNK_SIZE) {
		    count = 0;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buffer);
                        return(NULL);
                    }
		}
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
                if (len > maxLength) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                    xmlFree(buffer);
                    return(NULL);
                }
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    return(xmlStrndup(buf, len));
}